

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
* bech32::LocateErrors
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
             *__return_storage_ptr__,string *str,CharLimit limit)

{
  long lVar1;
  ulong uVar2;
  pointer *ppiVar3;
  char cVar4;
  uchar uVar5;
  size_type sVar6;
  undefined1 auVar7 [16];
  byte bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  int iVar12;
  uint32_t uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  size_t sVar18;
  char __c;
  int i;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ushort uVar23;
  uint uVar24;
  int iVar25;
  uint *puVar26;
  long lVar27;
  undefined8 uVar28;
  long lVar29;
  pointer piVar30;
  long lVar31;
  uint uVar32;
  size_type __new_size;
  data *__n;
  uint uVar33;
  data *pdVar34;
  uint uVar35;
  uint uVar36;
  ulong __res;
  data *values_00;
  pointer piVar37;
  char *__s;
  pointer piVar38;
  undefined1 *puVar39;
  long in_FS_OFFSET;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> enc;
  data values;
  string error_message;
  string hrp;
  int local_12c;
  int local_dc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_88;
  int local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __new_size = str->_M_string_length - limit;
  if (limit <= str->_M_string_length && __new_size != 0) {
    std::vector<int,_std::allocator<int>_>::resize(&local_a8,__new_size);
    piVar37 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage;
    piVar30 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
    piVar38 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    auVar10 = _DAT_00819700;
    auVar9 = _DAT_007e7450;
    auVar7 = _DAT_007e7440;
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar16 = (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish +
               (-4 - (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
      auVar42._8_4_ = (int)uVar16;
      auVar42._0_8_ = uVar16;
      auVar42._12_4_ = (int)(uVar16 >> 0x20);
      auVar40._0_8_ = uVar16 >> 2;
      auVar40._8_8_ = auVar42._8_8_ >> 2;
      uVar20 = 0;
      auVar40 = auVar40 ^ _DAT_007e7450;
      do {
        iVar19 = (int)uVar20;
        auVar41._8_4_ = iVar19;
        auVar41._0_8_ = uVar20;
        auVar41._12_4_ = (int)(uVar20 >> 0x20);
        auVar42 = (auVar41 | auVar7) ^ auVar9;
        iVar14 = auVar40._4_4_;
        iVar12 = (int)limit;
        if ((bool)(~(auVar42._4_4_ == iVar14 && auVar40._0_4_ < auVar42._0_4_ ||
                    iVar14 < auVar42._4_4_) & 1)) {
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar20] = iVar12 + iVar19;
        }
        if ((auVar42._12_4_ != auVar40._12_4_ || auVar42._8_4_ <= auVar40._8_4_) &&
            auVar42._12_4_ <= auVar40._12_4_) {
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar20 + 1] = iVar12 + iVar19 + 1;
        }
        auVar42 = (auVar41 | auVar10) ^ auVar9;
        iVar25 = auVar42._4_4_;
        if (iVar25 <= iVar14 && (iVar25 != iVar14 || auVar42._0_4_ <= auVar40._0_4_)) {
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar20 + 2] = iVar12 + iVar19 + 2;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar20 + 3] = iVar12 + iVar19 + 3;
        }
        uVar20 = uVar20 + 4;
      } while (((uVar16 >> 2) + 4 & 0xfffffffffffffffc) != uVar20);
    }
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Bech32 string too long",
               (allocator<char> *)&local_58);
    (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = piVar38;
    (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar30;
    (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = piVar37;
    goto LAB_0073a072;
  }
  bVar11 = anon_unknown_0::CheckCharacters(str,&local_a8);
  piVar37 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage;
  piVar30 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  piVar38 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (bVar11) {
    uVar16 = str->_M_string_length;
    if (uVar16 == 0) {
LAB_00739df0:
      __res = 0xffffffffffffffff;
    }
    else {
      uVar20 = uVar16;
      do {
        __res = uVar20 - 1;
        if (uVar20 == 0) goto LAB_00739df0;
        lVar29 = uVar20 - 1;
        uVar20 = __res;
      } while ((str->_M_dataplus)._M_p[lVar29] != '1');
    }
    if (__res != 0) {
      if (__res == 0xffffffffffffffff) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"Missing separator",(allocator<char> *)&local_58
                  );
        (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        goto LAB_0073a072;
      }
      if (__res + 6 < uVar16) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                  (&local_58,__res);
        if (__res != 0) {
          uVar16 = 0;
          do {
            cVar4 = (str->_M_dataplus)._M_p[uVar16];
            __c = cVar4 + ' ';
            if (0x19 < (byte)(cVar4 + 0xbfU)) {
              __c = cVar4;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(&local_58,__c);
            uVar16 = uVar16 + 1;
          } while (__res != uVar16);
        }
        sVar6 = str->_M_string_length;
        __n = (data *)(~__res + sVar6);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_c0,(size_type)__n,(allocator_type *)&local_88);
        lVar29 = 1;
        do {
          if (str->_M_string_length <= __res + lVar29) {
            local_60[0] = 1;
            local_60[1] = 2;
            lVar29 = 0;
            bVar11 = false;
            goto LAB_0073a0fa;
          }
          uVar5 = (anonymous_namespace)::CHARSET_REV[(byte)(str->_M_dataplus)._M_p[lVar29 + __res]];
          if (uVar5 == 0xff) {
            iVar12 = (int)(__res + lVar29);
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ = iVar12;
            if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_a8,
                         (iterator)
                         local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_88);
            }
            else {
              *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = iVar12;
              local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
            piVar37 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            piVar30 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            piVar38 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"Invalid Base 32 character",
                       (allocator<char> *)&local_88);
            (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = piVar38;
            (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar30;
            (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = piVar37;
          }
          else {
            local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar29 + -1] = uVar5;
          }
          lVar29 = lVar29 + 1;
        } while (uVar5 != 0xff);
        goto LAB_0073a873;
      }
    }
    local_58._M_dataplus._M_p._0_4_ = (int)__res;
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_a8,
                 (iterator)
                 local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_58);
    }
    else {
      *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = (int)__res;
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    piVar37 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage;
    piVar30 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
    piVar38 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Invalid separator position",
               (allocator<char> *)&local_58);
  }
  else {
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Invalid character or mixed case",
               (allocator<char> *)&local_58);
  }
  (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = piVar38;
  (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar30;
  (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = piVar37;
  goto LAB_0073a072;
  while( true ) {
    if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (uVar13 == uVar33) goto LAB_0073a873;
    lVar29 = lVar29 + 4;
    if (lVar29 == 8) break;
LAB_0073a0fa:
    values_00 = &local_c0;
    iVar12 = *(int *)((long)local_60 + lVar29);
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    anon_unknown_0::PreparePolynomialCoefficients(&local_d8,&local_58,values_00);
    uVar13 = anon_unknown_0::PolyMod(&local_d8);
    if (1 < iVar12 - 1U) {
LAB_0073a918:
      __assert_fail("encoding == Encoding::BECH32 || encoding == Encoding::BECH32M",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/bech32.cpp"
                    ,0x7b,"uint32_t bech32::(anonymous namespace)::EncodingConstant(Encoding)");
    }
    uVar33 = 0x2bc830a3;
    if (iVar12 == 1) {
      uVar33 = 1;
    }
    if (uVar13 == uVar33) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_dc);
      (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      uVar35 = ((uVar13 ^ uVar33) & 0x1f) * 0x100401;
      puVar26 = &(anonymous_namespace)::SYNDROME_CONSTS;
      lVar21 = 0;
      do {
        bVar8 = (byte)lVar21 & 0x1f;
        if (((uVar13 ^ uVar33) >> bVar8 & 0x20) == 0) {
          uVar32 = 0 >> bVar8;
        }
        else {
          uVar32 = *puVar26;
        }
        uVar35 = uVar35 ^ uVar32;
        lVar21 = lVar21 + 1;
        puVar26 = puVar26 + 1;
      } while (lVar21 != 0x19);
      uVar32 = uVar35 >> 0x14;
      if (0x3fffffff < uVar35) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          lVar21 = std::__throw_out_of_range_fmt
                             ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(ulong)uVar32,
                              0x400);
LAB_0073a961:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_out_of_range_fmt
                      ("array::at: __n (which is %zu) >= _Nm (which is %zu)",lVar21,0x400);
LAB_0073a98e:
            pdVar34 = values_00;
            uVar28 = 0x3ff;
LAB_0073a9a7:
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar28 = std::__throw_out_of_range_fmt
                                 ("array::at: __n (which is %zu) >= _Nm (which is %zu)",pdVar34,
                                  uVar28);
              if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_d8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage -
                                (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
              }
              if (local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_c0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_c0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,
                                CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                         local_58.field_2._M_local_buf[0]) + 1);
              }
              if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage -
                                (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar28);
              }
            }
          }
        }
        goto LAB_0073abbc;
      }
      uVar36 = uVar35 & 0x3ff;
      uVar35 = uVar35 >> 10 & 0x3ff;
      iVar14 = (int)*(short *)((anonymous_namespace)::tables + (ulong)uVar36 * 2 + 0x7fe);
      uVar16 = (ulong)iVar14;
      iVar19 = (int)*(short *)((anonymous_namespace)::tables + (ulong)uVar35 * 2 + 0x7fe);
      if ((((*(short *)((anonymous_namespace)::tables + (ulong)uVar36 * 2 + 0x7fe) == -1) ||
           (*(short *)((anonymous_namespace)::tables + (ulong)uVar35 * 2 + 0x7fe) == -1)) ||
          (*(short *)((anonymous_namespace)::tables + (ulong)uVar32 * 2 + 0x7fe) == -1)) ||
         (0x401004 <
          (iVar19 * 2 -
          (*(short *)((anonymous_namespace)::tables + (ulong)uVar32 * 2 + 0x7fe) + iVar14)) *
          -0x40100401 + 0x200804U)) {
        if (__n != (data *)0x0) {
          uVar22 = (ulong)iVar19;
          puVar39 = (anonymous_namespace)::tables;
          lVar1 = uVar22 * 2;
          lVar31 = 1;
          iVar14 = 0x3ff;
          uVar20 = uVar16;
          do {
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar22;
            lVar27 = SUB168(auVar7 * ZEXT816(0x40100401004011),8);
            if (uVar35 == 0) {
              uVar15 = 0;
            }
            else {
              uVar15 = (uint)*(short *)((uVar22 / 0x3ff) * -0x7fe + lVar1 + 0x87f74e + lVar31 * 2);
            }
            if (uVar32 != uVar15) {
              uVar15 = uVar15 ^ uVar32;
              if (0x3ff < uVar15) {
                if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0073abbc;
                std::__throw_out_of_range_fmt
                          ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(long)(int)uVar15,
                           0x400);
LAB_0073a8eb:
                if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0073abbc;
                std::__throw_out_of_range_fmt
                          ("array::at: __n (which is %zu) >= _Nm (which is %zu)",lVar27,0x400);
                goto LAB_0073a918;
              }
              if (uVar36 == 0) {
                uVar24 = 0;
              }
              else {
                uVar24 = (uint)*(short *)((uVar20 / 0x3ff) * -0x7fe + uVar16 * 2 + 0x87f74e +
                                         lVar31 * 2);
              }
              if (uVar35 != uVar24) {
                lVar27 = (long)(int)(uVar24 ^ uVar35);
                if (0x3ff < uVar24) goto LAB_0073a8eb;
                iVar19 = (int)*(short *)((anonymous_namespace)::tables +
                                        (long)(int)uVar15 * 2 + 0x7fe) -
                         (int)*(short *)((anonymous_namespace)::tables + lVar27 * 2 + 0x7fe);
                iVar25 = (int)((ulong)((long)(iVar19 + 0x3ff) * -0x7fdff7fd) >> 0x20) + iVar19 +
                         0x3ff;
                uVar15 = iVar19 + ((iVar25 >> 9) - (iVar25 >> 0x1f)) * -0x3ff + 0x3ff;
                pdVar34 = (data *)(long)(int)uVar15;
                if ((pdVar34 < __n) && (values_00 = (data *)(lVar31 - 1), values_00 != pdVar34)) {
                  if (uVar36 == 0) {
                    uVar24 = 0;
                  }
                  else {
                    uVar2 = (long)&(pdVar34->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_start + uVar16;
                    uVar24 = (uint)*(short *)((anonymous_namespace)::tables +
                                             (ulong)(uint)((int)uVar2 +
                                                          (int)(uVar2 / 0x3ff) * -0x3ff) * 2);
                  }
                  if (uVar35 != uVar24) {
                    lVar21 = (long)(int)(uVar24 ^ uVar35);
                    if (0x3ff < uVar24) goto LAB_0073a961;
                    if ((data *)0x3fe < values_00) goto LAB_0073a98e;
                    if (0x3fe < uVar15) {
                      uVar28 = 0x3ff;
                      goto LAB_0073a9a7;
                    }
                    uVar23 = *(ushort *)((anonymous_namespace)::tables + (long)pdVar34 * 2) ^
                             *(ushort *)puVar39;
                    if (0x3ff < uVar23) {
                      uVar28 = 0x400;
                      pdVar34 = (data *)(long)(short)uVar23;
                      goto LAB_0073a9a7;
                    }
                    if (((((int)*(short *)((anonymous_namespace)::tables + lVar27 * 2 + 0x7fe) +
                          uVar15 * 0x1a) -
                         (int)*(short *)((anonymous_namespace)::tables +
                                        (long)(short)uVar23 * 2 + 0x7fe)) * 0x3e0f83e1 + 0x3e0f85d <
                         0x7c1f07d) &&
                       ((((int)*(short *)((anonymous_namespace)::tables + lVar21 * 2 + 0x7fe) -
                         (int)*(short *)((anonymous_namespace)::tables +
                                        (long)(short)uVar23 * 2 + 0x7fe)) + iVar14) * 0x3e0f83e1 +
                        0x3e0f83eU < 0x7c1f07d)) {
                      if (pdVar34 < (data *)(lVar31 - 1U)) {
                        local_dc = (int)str->_M_string_length - (int)lVar31;
                        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                    (&local_88,
                                     (iterator)
                                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish,&local_dc);
                        }
                        else {
                          *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish = local_dc;
                          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish + 1;
                        }
                        local_dc = ~uVar15 + (int)str->_M_string_length;
                        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish !=
                            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish = local_dc;
                          goto LAB_0073a57b;
                        }
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (&local_88,
                                   (iterator)
                                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish,&local_dc);
                      }
                      else {
                        local_dc = ~uVar15 + (int)str->_M_string_length;
                        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                    (&local_88,
                                     (iterator)
                                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish,&local_dc);
                        }
                        else {
                          *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish = local_dc;
                          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish + 1;
                        }
                        local_dc = (int)str->_M_string_length - (int)lVar31;
                        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish !=
                            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish = local_dc;
                          goto LAB_0073a57b;
                        }
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (&local_88,
                                   (iterator)
                                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish,&local_dc);
                      }
                      break;
                    }
                  }
                }
              }
            }
            lVar31 = lVar31 + 1;
            uVar22 = uVar22 + 1;
            uVar20 = uVar20 + 1;
            iVar14 = iVar14 + 0x1a;
            puVar39 = (undefined1 *)((long)puVar39 + 2);
          } while (sVar6 - __res != lVar31);
        }
      }
      else {
        iVar19 = iVar19 - iVar14;
        iVar25 = (int)((ulong)((long)(iVar19 + 0x3ff) * -0x7fdff7fd) >> 0x20) + iVar19 + 0x3ff;
        uVar35 = iVar19 + ((iVar25 >> 9) - (iVar25 >> 0x1f)) * -0x3ff + 0x3ff;
        if (((data *)(long)(int)uVar35 < __n) &&
           (iVar14 * 0x3e0f83e1 + uVar35 * 0x4d9364da + 0x3e0f83e < 0x7c1f07d)) {
          local_dc = ~uVar35 + (int)str->_M_string_length;
          if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_88,
                       (iterator)
                       local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_dc);
          }
          else {
            *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_dc;
LAB_0073a57b:
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      piVar30 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      piVar38 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start ==
           local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish) ||
         ((local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start !=
           local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish &&
          ((ulong)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) <
           (ulong)((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start))))) {
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        if (piVar38 != (pointer)0x0) {
          operator_delete(piVar38,(long)piVar30 - (long)piVar38);
        }
        if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          bVar11 = true;
          local_12c = iVar12;
        }
      }
    }
  }
  pcVar17 = "Invalid Bech32 checksum";
  if (local_12c != 1) {
    pcVar17 = "Invalid checksum";
  }
  if (!bVar11) {
    pcVar17 = "Invalid checksum";
  }
  __s = "Invalid Bech32m checksum";
  if (local_12c != 2) {
    __s = pcVar17;
  }
  if (!bVar11) {
    __s = pcVar17;
  }
  ppiVar3 = &local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)ppiVar3;
  sVar18 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,__s,__s + sVar18);
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,
             local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish +
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
  (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((pointer *)
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != ppiVar3) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
LAB_0073a873:
  if (local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
LAB_0073a072:
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0073abbc:
  __stack_chk_fail();
}

Assistant:

std::pair<std::string, std::vector<int>> LocateErrors(const std::string& str, CharLimit limit) {
    std::vector<int> error_locations{};

    if (str.size() > limit) {
        error_locations.resize(str.size() - limit);
        std::iota(error_locations.begin(), error_locations.end(), static_cast<int>(limit));
        return std::make_pair("Bech32 string too long", std::move(error_locations));
    }

    if (!CheckCharacters(str, error_locations)){
        return std::make_pair("Invalid character or mixed case", std::move(error_locations));
    }

    size_t pos = str.rfind('1');
    if (pos == str.npos) {
        return std::make_pair("Missing separator", std::vector<int>{});
    }
    if (pos == 0 || pos + CHECKSUM_SIZE >= str.size()) {
        error_locations.push_back(pos);
        return std::make_pair("Invalid separator position", std::move(error_locations));
    }

    std::string hrp;
    hrp.reserve(pos);
    for (size_t i = 0; i < pos; ++i) {
        hrp += LowerCase(str[i]);
    }

    size_t length = str.size() - 1 - pos; // length of data part
    data values(length);
    for (size_t i = pos + 1; i < str.size(); ++i) {
        unsigned char c = str[i];
        int8_t rev = CHARSET_REV[c];
        if (rev == -1) {
            error_locations.push_back(i);
            return std::make_pair("Invalid Base 32 character", std::move(error_locations));
        }
        values[i - pos - 1] = rev;
    }

    // We attempt error detection with both bech32 and bech32m, and choose the one with the fewest errors
    // We can't simply use the segwit version, because that may be one of the errors
    std::optional<Encoding> error_encoding;
    for (Encoding encoding : {Encoding::BECH32, Encoding::BECH32M}) {
        std::vector<int> possible_errors;
        // Recall that (expanded hrp + values) is interpreted as a list of coefficients of a polynomial
        // over GF(32). PolyMod computes the "remainder" of this polynomial modulo the generator G(x).
        auto enc = PreparePolynomialCoefficients(hrp, values);
        uint32_t residue = PolyMod(enc) ^ EncodingConstant(encoding);

        // All valid codewords should be multiples of G(x), so this remainder (after XORing with the encoding
        // constant) should be 0 - hence 0 indicates there are no errors present.
        if (residue != 0) {
            // If errors are present, our polynomial must be of the form C(x) + E(x) where C is the valid
            // codeword (a multiple of G(x)), and E encodes the errors.
            uint32_t syn = Syndrome(residue);

            // Unpack the three 10-bit syndrome values
            int s0 = syn & 0x3FF;
            int s1 = (syn >> 10) & 0x3FF;
            int s2 = syn >> 20;

            // Get the discrete logs of these values in GF1024 for more efficient computation
            int l_s0 = GF1024_LOG.at(s0);
            int l_s1 = GF1024_LOG.at(s1);
            int l_s2 = GF1024_LOG.at(s2);

            // First, suppose there is only a single error. Then E(x) = e1*x^p1 for some position p1
            // Then s0 = E((e)^997) = e1*(e)^(997*p1) and s1 = E((e)^998) = e1*(e)^(998*p1)
            // Therefore s1/s0 = (e)^p1, and by the same logic, s2/s1 = (e)^p1 too.
            // Hence, s1^2 == s0*s2, which is exactly the condition we check first:
            if (l_s0 != -1 && l_s1 != -1 && l_s2 != -1 && (2 * l_s1 - l_s2 - l_s0 + 2046) % 1023 == 0) {
                // Compute the error position p1 as l_s1 - l_s0 = p1 (mod 1023)
                size_t p1 = (l_s1 - l_s0 + 1023) % 1023; // the +1023 ensures it is positive
                // Now because s0 = e1*(e)^(997*p1), we get e1 = s0/((e)^(997*p1)). Remember that (e)^1023 = 1,
                // so 1/((e)^997) = (e)^(1023-997).
                int l_e1 = l_s0 + (1023 - 997) * p1;
                // Finally, some sanity checks on the result:
                // - The error position should be within the length of the data
                // - e1 should be in GF(32), which implies that e1 = (e)^(33k) for some k (the 31 non-zero elements
                // of GF(32) form an index 33 subgroup of the 1023 non-zero elements of GF(1024)).
                if (p1 < length && !(l_e1 % 33)) {
                    // Polynomials run from highest power to lowest, so the index p1 is from the right.
                    // We don't return e1 because it is dangerous to suggest corrections to the user,
                    // the user should check the address themselves.
                    possible_errors.push_back(str.size() - p1 - 1);
                }
            // Otherwise, suppose there are two errors. Then E(x) = e1*x^p1 + e2*x^p2.
            } else {
                // For all possible first error positions p1
                for (size_t p1 = 0; p1 < length; ++p1) {
                    // We have guessed p1, and want to solve for p2. Recall that E(x) = e1*x^p1 + e2*x^p2, so
                    // s0 = E((e)^997) = e1*(e)^(997^p1) + e2*(e)^(997*p2), and similar for s1 and s2.
                    //
                    // Consider s2 + s1*(e)^p1
                    //          = 2e1*(e)^(999^p1) + e2*(e)^(999*p2) + e2*(e)^(998*p2)*(e)^p1
                    //          = e2*(e)^(999*p2) + e2*(e)^(998*p2)*(e)^p1
                    //    (Because we are working in characteristic 2.)
                    //          = e2*(e)^(998*p2) ((e)^p2 + (e)^p1)
                    //
                    int s2_s1p1 = s2 ^ (s1 == 0 ? 0 : GF1024_EXP.at((l_s1 + p1) % 1023));
                    if (s2_s1p1 == 0) continue;
                    int l_s2_s1p1 = GF1024_LOG.at(s2_s1p1);

                    // Similarly, s1 + s0*(e)^p1
                    //          = e2*(e)^(997*p2) ((e)^p2 + (e)^p1)
                    int s1_s0p1 = s1 ^ (s0 == 0 ? 0 : GF1024_EXP.at((l_s0 + p1) % 1023));
                    if (s1_s0p1 == 0) continue;
                    int l_s1_s0p1 = GF1024_LOG.at(s1_s0p1);

                    // So, putting these together, we can compute the second error position as
                    // (e)^p2 = (s2 + s1^p1)/(s1 + s0^p1)
                    // p2 = log((e)^p2)
                    size_t p2 = (l_s2_s1p1 - l_s1_s0p1 + 1023) % 1023;

                    // Sanity checks that p2 is a valid position and not the same as p1
                    if (p2 >= length || p1 == p2) continue;

                    // Now we want to compute the error values e1 and e2.
                    // Similar to above, we compute s1 + s0*(e)^p2
                    //          = e1*(e)^(997*p1) ((e)^p1 + (e)^p2)
                    int s1_s0p2 = s1 ^ (s0 == 0 ? 0 : GF1024_EXP.at((l_s0 + p2) % 1023));
                    if (s1_s0p2 == 0) continue;
                    int l_s1_s0p2 = GF1024_LOG.at(s1_s0p2);

                    // And compute (the log of) 1/((e)^p1 + (e)^p2))
                    int inv_p1_p2 = 1023 - GF1024_LOG.at(GF1024_EXP.at(p1) ^ GF1024_EXP.at(p2));

                    // Then (s1 + s0*(e)^p1) * (1/((e)^p1 + (e)^p2)))
                    //         = e2*(e)^(997*p2)
                    // Then recover e2 by dividing by (e)^(997*p2)
                    int l_e2 = l_s1_s0p1 + inv_p1_p2 + (1023 - 997) * p2;
                    // Check that e2 is in GF(32)
                    if (l_e2 % 33) continue;

                    // In the same way, (s1 + s0*(e)^p2) * (1/((e)^p1 + (e)^p2)))
                    //         = e1*(e)^(997*p1)
                    // So recover e1 by dividing by (e)^(997*p1)
                    int l_e1 = l_s1_s0p2 + inv_p1_p2 + (1023 - 997) * p1;
                    // Check that e1 is in GF(32)
                    if (l_e1 % 33) continue;

                    // Again, we do not return e1 or e2 for safety.
                    // Order the error positions from the left of the string and return them
                    if (p1 > p2) {
                        possible_errors.push_back(str.size() - p1 - 1);
                        possible_errors.push_back(str.size() - p2 - 1);
                    } else {
                        possible_errors.push_back(str.size() - p2 - 1);
                        possible_errors.push_back(str.size() - p1 - 1);
                    }
                    break;
                }
            }
        } else {
            // No errors
            return std::make_pair("", std::vector<int>{});
        }

        if (error_locations.empty() || (!possible_errors.empty() && possible_errors.size() < error_locations.size())) {
            error_locations = std::move(possible_errors);
            if (!error_locations.empty()) error_encoding = encoding;
        }
    }
    std::string error_message = error_encoding == Encoding::BECH32M ? "Invalid Bech32m checksum"
                              : error_encoding == Encoding::BECH32 ? "Invalid Bech32 checksum"
                              : "Invalid checksum";

    return std::make_pair(error_message, std::move(error_locations));
}